

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

void __thiscall
CPubKey::
Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (CPubKey *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          pbegin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 pend)

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  size_t sStack_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pend._M_current != pbegin._M_current) {
    bVar1 = *pbegin._M_current;
    if ((bVar1 & 0xfe) == 2) {
      sStack_10 = 0x21;
    }
    else {
      if ((7 < bVar1) || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_00239a13;
      sStack_10 = 0x41;
    }
    if ((long)pend._M_current - (long)pbegin._M_current == sStack_10) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        memcpy(this,pbegin._M_current,sStack_10);
        return;
      }
      goto LAB_00239a27;
    }
  }
LAB_00239a13:
  this->vch[0] = 0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00239a27:
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }